

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O2

void __thiscall CSound::StopAll(CSound *this)

{
  long lVar1;
  long lVar2;
  undefined4 uVar3;
  
  lock_wait(m_SoundLock);
  for (lVar2 = 0; lVar2 != 0xa00; lVar2 = lVar2 + 0x28) {
    lVar1 = *(long *)((long)&m_aVoices[0].m_pSample + lVar2);
    if (lVar1 != 0) {
      uVar3 = 0;
      if ((*(byte *)((long)&m_aVoices[0].m_Flags + lVar2) & 1) != 0) {
        uVar3 = *(undefined4 *)((long)&m_aVoices[0].m_Tick + lVar2);
      }
      *(undefined4 *)(lVar1 + 0x1c) = uVar3;
    }
    *(undefined8 *)((long)&m_aVoices[0].m_pSample + lVar2) = 0;
  }
  lock_unlock(m_SoundLock);
  return;
}

Assistant:

void CSound::StopAll()
{
	// TODO: a nice fade out
	lock_wait(m_SoundLock);
	for(int i = 0; i < NUM_VOICES; i++)
	{
		if(m_aVoices[i].m_pSample)
		{
			if(m_aVoices[i].m_Flags & FLAG_LOOP)
				m_aVoices[i].m_pSample->m_PausedAt = m_aVoices[i].m_Tick;
			else
				m_aVoices[i].m_pSample->m_PausedAt = 0;
		}
		m_aVoices[i].m_pSample = 0;
	}
	lock_unlock(m_SoundLock);
}